

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBac.c
# Opt level: O2

void Bac_ManWriteBacNtk(Vec_Str_t *vOut,Bac_Ntk_t *pNtk)

{
  Vec_StrPushBuffer(vOut,(pNtk->vType).pArray,(pNtk->vType).nSize);
  Vec_StrPushBuffer(vOut,(char *)(pNtk->vFanin).pArray,(pNtk->vType).nSize << 2);
  Vec_StrPushBuffer(vOut,(char *)(pNtk->vInfo).pArray,((pNtk->vInfo).nSize / 3) * 0xc);
  return;
}

Assistant:

void Bac_ManWriteBacNtk( Vec_Str_t * vOut, Bac_Ntk_t * pNtk )
{
    //char * pName; int iObj, NameId;
    Vec_StrPushBuffer( vOut, (char *)Vec_StrArray(&pNtk->vType),       Bac_NtkObjNum(pNtk) );
    Vec_StrPushBuffer( vOut, (char *)Vec_IntArray(&pNtk->vFanin),  4 * Bac_NtkObjNum(pNtk) );
    Vec_StrPushBuffer( vOut, (char *)Vec_IntArray(&pNtk->vInfo),  12 * Bac_NtkInfoNum(pNtk) );
/*
    // write input/output/box names
    Bac_NtkForEachPiMain( pNtk, iObj, i )
    {
        pName = Bac_ObjNameStr( pNtk, iObj );
        Vec_StrPrintStr( vOut, pName );
        Vec_StrPush( vOut, '\0' );
    }
    Bac_NtkForEachPoMain( pNtk, iObj, i )
    {
        pName = Bac_ObjNameStr( pNtk, iObj );
        Vec_StrPrintStr( vOut, pName );
        Vec_StrPush( vOut, '\0' );
    }
    Bac_NtkForEachBox( pNtk, iObj )
    {
        pName = Bac_ObjNameStr( pNtk, iObj );  
        Vec_StrPrintStr( vOut, pName );
        Vec_StrPush( vOut, '\0' );
    }
*/
}